

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_List.h
# Opt level: O3

void __thiscall
axl::sl::
OwningListBase<axl::io::SerialPortDesc,_axl::sl::ImplicitPtrCast<axl::io::SerialPortDesc,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::SerialPortDesc,_axl::sl::ImplicitPtrCast<axl::io::SerialPortDesc,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::SerialPortDesc,_axl::sl::ImplicitPtrCast<axl::io::SerialPortDesc,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::io::SerialPortDesc>_>
::clear(OwningListBase<axl::io::SerialPortDesc,_axl::sl::ImplicitPtrCast<axl::io::SerialPortDesc,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::SerialPortDesc,_axl::sl::ImplicitPtrCast<axl::io::SerialPortDesc,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::SerialPortDesc,_axl::sl::ImplicitPtrCast<axl::io::SerialPortDesc,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::io::SerialPortDesc>_>
        *this)

{
  SerialPortDesc *pSVar1;
  SerialPortDesc *p;
  SerialPortDesc *this_00;
  
  this_00 = *(SerialPortDesc **)this;
  if (this_00 != (SerialPortDesc *)0x0) {
    do {
      pSVar1 = (SerialPortDesc *)(this_00->super_ListLink).m_next;
      io::SerialPortDesc::~SerialPortDesc(this_00);
      operator_delete(this_00);
      this_00 = pSVar1;
    } while (pSVar1 != (SerialPortDesc *)0x0);
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
    *(undefined8 *)(this + 0x10) = 0;
  }
  return;
}

Assistant:

void
	clear() {
		if (!this->m_head)
			return;

		ListLink* link = GetLink()(this->m_head);
		while (link) {
			T* p = Iterator::getEntryFromLink(link);
			link = link->getNext();
			Delete()(p);
		}

		this->construct();
	}